

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestorderCancelReplaceRequestSetString::~TestorderCancelReplaceRequestSetString
          (TestorderCancelReplaceRequestSetString *this)

{
  TestorderCancelReplaceRequestSetString *this_local;
  
  ~TestorderCancelReplaceRequestSetString(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(orderCancelReplaceRequestSetString)
{
  OrderCancelReplaceRequest object;

  object.setString
    ( "8=FIX.4.2\0019=63\00135=G\00111=CLIENTID\00121=1\001"
      "40=3\00141=ORIGINALID\00154=2\00155=MSFT\00160=TODAY\001"
      "10=228\001" );

  OrigClOrdID origClOrdID;
  ClOrdID clOrdID;
  HandlInst handlInst;
  Symbol symbol;
  Side side;
  TransactTime transactTime;
  OrdType ordType;
  CHECK_EQUAL( "ORIGINALID", object.get( origClOrdID ) );
  CHECK_EQUAL( "CLIENTID", object.get( clOrdID ) );
  CHECK_EQUAL( '1', object.get( handlInst ) );
  CHECK_EQUAL( "MSFT", object.get( symbol ) );
  CHECK_EQUAL( '2', object.get( side ) );
  CHECK_EQUAL( '3', object.get( ordType ) );
}